

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

void __thiscall
Highs::formIllConditioningLp0
          (Highs *this,HighsLp *ill_conditioning_lp,vector<int,_std::allocator<int>_> *basic_var,
          bool constraint)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<int,_std::allocator<int>_> *this_00;
  iterator iVar2;
  pointer piVar3;
  undefined7 in_register_00000009;
  int *__args;
  double *__args_00;
  long lVar4;
  iterator iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  vector<int,std::allocator<int>> *this_01;
  HighsInt ill_conditioning_lp_e_row;
  int local_7c;
  double local_78;
  vector<int,std::allocator<int>> *local_70;
  int local_64;
  vector<int,std::allocator<int>> *local_60;
  vector<int,std::allocator<int>> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,std::allocator<double>> *local_48;
  vector<double,std::allocator<double>> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_50 = (vector<double,_std::allocator<double>_> *)
             CONCAT44(local_50._4_4_,(int)CONCAT71(in_register_00000009,constraint));
  ill_conditioning_lp->num_row_ = (this->model_).lp_.num_row_ + 1;
  local_70 = (vector<int,std::allocator<int>> *)basic_var;
  if (0 < (this->model_).lp_.num_row_) {
    iVar7 = 0;
    do {
      local_78 = 0.0;
      iVar2._M_current =
           (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&ill_conditioning_lp->row_lower_,iVar2,&local_78);
      }
      else {
        *iVar2._M_current = 0.0;
        (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_78 = 0.0;
      iVar2._M_current =
           (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&ill_conditioning_lp->row_upper_,iVar2,&local_78);
      }
      else {
        *iVar2._M_current = 0.0;
        (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (this->model_).lp_.num_row_);
  }
  local_78 = 1.0;
  iVar2._M_current =
       (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&ill_conditioning_lp->row_lower_,iVar2,&local_78);
  }
  else {
    *iVar2._M_current = 1.0;
    (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_78 = 1.0;
  iVar2._M_current =
       (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&ill_conditioning_lp->row_upper_,iVar2,&local_78);
  }
  else {
    *iVar2._M_current = 1.0;
    (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  this_01 = local_70;
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  local_64 = ill_conditioning_lp->num_row_;
  (ill_conditioning_lp->a_matrix_).num_row_ = local_64;
  local_64 = local_64 + -1;
  local_7c = 0;
  iVar7 = (this->model_).lp_.num_col_;
  if (0 < iVar7) {
    local_58 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_cost_;
    local_40 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_lower_;
    local_48 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_upper_;
    local_60 = (vector<int,std::allocator<int>> *)&(ill_conditioning_lp->a_matrix_).index_;
    pvVar1 = &(ill_conditioning_lp->a_matrix_).value_;
    local_38 = &(ill_conditioning_lp->a_matrix_).start_;
    do {
      if ((this->basis_).col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[local_7c] == kBasic) {
        iVar5._M_current = *(int **)(this_01 + 8);
        if (iVar5._M_current == *(int **)(this_01 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_01,iVar5,&local_7c);
        }
        else {
          *iVar5._M_current = local_7c;
          *(int **)(this_01 + 8) = iVar5._M_current + 1;
        }
        local_78 = 0.0;
        iVar2._M_current =
             (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_58,iVar2,&local_78);
        }
        else {
          *iVar2._M_current = 0.0;
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_78 = -INFINITY;
        iVar2._M_current =
             (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_40,iVar2,&local_78);
        }
        else {
          *iVar2._M_current = -INFINITY;
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar2._M_current =
             (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_48,iVar2,(double *)&kHighsInf);
        }
        else {
          *iVar2._M_current = INFINITY;
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        piVar3 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar7 = piVar3[local_7c];
        lVar4 = (long)iVar7;
        if (iVar7 < piVar3[(long)local_7c + 1]) {
          lVar8 = lVar4 * 4;
          lVar6 = lVar4 * 8;
          do {
            __args = (int *)((long)(this->model_).lp_.a_matrix_.index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar8);
            iVar5._M_current =
                 (ill_conditioning_lp->a_matrix_).index_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
            if (iVar5._M_current ==
                (ill_conditioning_lp->a_matrix_).index_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_60,iVar5,__args);
            }
            else {
              *iVar5._M_current = *__args;
              (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            __args_00 = (double *)
                        ((long)(this->model_).lp_.a_matrix_.value_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar6);
            iVar2._M_current =
                 (ill_conditioning_lp->a_matrix_).value_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish;
            if (iVar2._M_current ==
                (ill_conditioning_lp->a_matrix_).value_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)pvVar1,iVar2,__args_00);
            }
            else {
              *iVar2._M_current = *__args_00;
              (ill_conditioning_lp->a_matrix_).value_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = iVar2._M_current + 1;
            }
            lVar4 = lVar4 + 1;
            lVar8 = lVar8 + 4;
            lVar6 = lVar6 + 8;
          } while (lVar4 < (this->model_).lp_.a_matrix_.start_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)local_7c + 1]);
        }
        this_01 = local_70;
        iVar5._M_current =
             (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if ((char)local_50 == '\0') {
          if (iVar5._M_current ==
              (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_60,iVar5,&local_64);
          }
          else {
            *iVar5._M_current = local_64;
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          local_78 = 1.0;
          iVar2._M_current =
               (ill_conditioning_lp->a_matrix_).value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar2._M_current ==
              (ill_conditioning_lp->a_matrix_).value_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar1,iVar2,&local_78);
          }
          else {
            *iVar2._M_current = 1.0;
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          iVar5._M_current =
               (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        iVar7 = (int)((ulong)((long)iVar5._M_current -
                             (long)(ill_conditioning_lp->a_matrix_).index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
        local_78 = (double)CONCAT44(local_78._4_4_,iVar7);
        iVar5._M_current =
             (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_38,iVar5,(int *)&local_78);
        }
        else {
          *iVar5._M_current = iVar7;
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar7 = (this->model_).lp_.num_col_;
      }
      local_7c = local_7c + 1;
    } while (local_7c < iVar7);
  }
  local_7c = 0;
  iVar7 = (this->model_).lp_.num_row_;
  if (0 < iVar7) {
    local_70 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_cost_;
    local_58 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_lower_;
    local_40 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_upper_;
    local_60 = (vector<int,std::allocator<int>> *)&(ill_conditioning_lp->a_matrix_).index_;
    pvVar1 = &(ill_conditioning_lp->a_matrix_).value_;
    local_48 = (vector<double,std::allocator<double>> *)&(ill_conditioning_lp->a_matrix_).start_;
    do {
      if ((this->basis_).row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[local_7c] == kBasic) {
        iVar7 = local_7c + (this->model_).lp_.num_col_;
        local_78 = (double)CONCAT44(local_78._4_4_,iVar7);
        iVar5._M_current = *(int **)(this_01 + 8);
        if ((pointer)iVar5._M_current == *(pointer *)(this_01 + 0x10)) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)this_01,iVar5,(int *)&local_78);
        }
        else {
          *iVar5._M_current = iVar7;
          *(int **)(this_01 + 8) = iVar5._M_current + 1;
        }
        local_78 = 0.0;
        iVar2._M_current =
             (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_70,iVar2,&local_78);
        }
        else {
          *iVar2._M_current = 0.0;
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_78 = -INFINITY;
        iVar2._M_current =
             (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_58,iVar2,&local_78);
        }
        else {
          *iVar2._M_current = -INFINITY;
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar2._M_current =
             (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_40,iVar2,(double *)&kHighsInf);
        }
        else {
          *iVar2._M_current = INFINITY;
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar5._M_current =
             (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_60,iVar5,&local_7c);
        }
        else {
          *iVar5._M_current = local_7c;
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_78 = -1.0;
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (pvVar1,iVar2,&local_78);
        }
        else {
          *iVar2._M_current = -1.0;
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        iVar5._M_current =
             (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if ((char)local_50 == '\0') {
          if (iVar5._M_current ==
              (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_60,iVar5,&local_64);
          }
          else {
            *iVar5._M_current = local_64;
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          local_78 = 1.0;
          iVar2._M_current =
               (ill_conditioning_lp->a_matrix_).value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar2._M_current ==
              (ill_conditioning_lp->a_matrix_).value_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar1,iVar2,&local_78);
          }
          else {
            *iVar2._M_current = 1.0;
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          iVar5._M_current =
               (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        iVar7 = (int)((ulong)((long)iVar5._M_current -
                             (long)(ill_conditioning_lp->a_matrix_).index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
        local_78 = (double)CONCAT44(local_78._4_4_,iVar7);
        iVar5._M_current =
             (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_48,iVar5,(int *)&local_78);
        }
        else {
          *iVar5._M_current = iVar7;
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar7 = (this->model_).lp_.num_row_;
      }
      local_7c = local_7c + 1;
    } while (local_7c < iVar7);
  }
  if ((char)local_50 != '\0') {
    local_7c = 0;
    if (0 < iVar7) {
      do {
        iVar5._M_current =
             (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&(ill_conditioning_lp->a_matrix_).index_,
                     iVar5,&local_7c);
        }
        else {
          *iVar5._M_current = local_7c;
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_78 = 1.0;
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&(ill_conditioning_lp->a_matrix_).value_,iVar2,&local_78);
        }
        else {
          *iVar2._M_current = 1.0;
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        local_7c = local_7c + 1;
      } while (local_7c < (this->model_).lp_.num_row_);
    }
    iVar7 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(ill_conditioning_lp->a_matrix_).index_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    local_78 = (double)CONCAT44(local_78._4_4_,iVar7);
    iVar5._M_current =
         (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&(ill_conditioning_lp->a_matrix_).start_,iVar5,(int *)&local_78);
    }
    else {
      *iVar5._M_current = iVar7;
      (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    iVar7 = (this->model_).lp_.num_row_;
    (ill_conditioning_lp->a_matrix_).num_row_ = iVar7;
    (ill_conditioning_lp->a_matrix_).num_col_ = iVar7 + 1;
    HighsSparseMatrix::ensureRowwise(&ill_conditioning_lp->a_matrix_);
    (ill_conditioning_lp->a_matrix_).format_ = kColwise;
    iVar7 = (this->model_).lp_.num_row_;
  }
  local_7c = 0;
  if (0 < iVar7) {
    local_60 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_cost_;
    local_50 = &ill_conditioning_lp->col_lower_;
    local_70 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_upper_;
    local_58 = (vector<int,std::allocator<int>> *)&(ill_conditioning_lp->a_matrix_).index_;
    pvVar1 = &(ill_conditioning_lp->a_matrix_).value_;
    this_00 = &(ill_conditioning_lp->a_matrix_).start_;
    do {
      local_78 = 1.0;
      iVar2._M_current =
           (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_60,iVar2,&local_78);
      }
      else {
        *iVar2._M_current = 1.0;
        (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_78 = 0.0;
      iVar2._M_current =
           (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_50,iVar2,&local_78);
      }
      else {
        *iVar2._M_current = 0.0;
        (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar2._M_current =
           (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)local_70,iVar2,(double *)&kHighsInf);
      }
      else {
        *iVar2._M_current = INFINITY;
        (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar5._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_58,iVar5,&local_7c);
      }
      else {
        *iVar5._M_current = local_7c;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_78 = 1.0;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pvVar1,iVar2,&local_78);
      }
      else {
        *iVar2._M_current = 1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar7 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(ill_conditioning_lp->a_matrix_).index_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      local_78 = (double)CONCAT44(local_78._4_4_,iVar7);
      iVar5._M_current =
           (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,iVar5,(int *)&local_78);
      }
      else {
        *iVar5._M_current = iVar7;
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_78 = 1.0;
      iVar2._M_current =
           (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_60,iVar2,&local_78);
      }
      else {
        *iVar2._M_current = 1.0;
        (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_78 = 0.0;
      iVar2._M_current =
           (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_50,iVar2,&local_78);
      }
      else {
        *iVar2._M_current = 0.0;
        (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar2._M_current =
           (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)local_70,iVar2,(double *)&kHighsInf);
      }
      else {
        *iVar2._M_current = INFINITY;
        (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar5._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_58,iVar5,&local_7c);
      }
      else {
        *iVar5._M_current = local_7c;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_78 = -1.0;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pvVar1,iVar2,&local_78);
      }
      else {
        *iVar2._M_current = -1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar7 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(ill_conditioning_lp->a_matrix_).index_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      local_78 = (double)CONCAT44(local_78._4_4_,iVar7);
      iVar5._M_current =
           (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,iVar5,(int *)&local_78);
      }
      else {
        *iVar5._M_current = iVar7;
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_7c = local_7c + 1;
      iVar7 = (this->model_).lp_.num_row_;
    } while (local_7c < iVar7);
  }
  ill_conditioning_lp->num_col_ = iVar7 * 3;
  (ill_conditioning_lp->a_matrix_).num_col_ = iVar7 * 3;
  (ill_conditioning_lp->a_matrix_).num_row_ = ill_conditioning_lp->num_row_;
  return;
}

Assistant:

void Highs::formIllConditioningLp0(HighsLp& ill_conditioning_lp,
                                   std::vector<HighsInt>& basic_var,
                                   const bool constraint) {
  HighsLp& incumbent_lp = this->model_.lp_;
  // Conditioning LP minimizes the infeasibilities of
  //
  // [B^T]y = [0]; y free - for constraint view
  // [e^T]    [1]
  //
  // [ B ]y = [0]; y free - for column view
  // [e^T]    [1]
  //
  ill_conditioning_lp.num_row_ = incumbent_lp.num_row_ + 1;
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    ill_conditioning_lp.row_lower_.push_back(0);
    ill_conditioning_lp.row_upper_.push_back(0);
  }
  ill_conditioning_lp.row_lower_.push_back(1);
  ill_conditioning_lp.row_upper_.push_back(1);
  HighsSparseMatrix& incumbent_matrix = incumbent_lp.a_matrix_;
  incumbent_matrix.ensureColwise();
  HighsSparseMatrix& ill_conditioning_matrix = ill_conditioning_lp.a_matrix_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
  // Form the basis matrix and
  //
  // * For constraint view, add the column e, and transpose the
  // * resulting matrix
  //
  // * For column view, add a unit entry to each column
  //
  const HighsInt ill_conditioning_lp_e_row = ill_conditioning_lp.num_row_ - 1;
  for (HighsInt iCol = 0; iCol < incumbent_lp.num_col_; iCol++) {
    if (this->basis_.col_status[iCol] != HighsBasisStatus::kBasic) continue;
    // Basic column goes into conditioning LP, possibly with unit
    // coefficient for constraint e^Ty=1
    basic_var.push_back(iCol);
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    for (HighsInt iEl = incumbent_matrix.start_[iCol];
         iEl < incumbent_matrix.start_[iCol + 1]; iEl++) {
      ill_conditioning_matrix.index_.push_back(incumbent_matrix.index_[iEl]);
      ill_conditioning_matrix.value_.push_back(incumbent_matrix.value_[iEl]);
    }
    if (!constraint) {
      ill_conditioning_matrix.index_.push_back(ill_conditioning_lp_e_row);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    if (this->basis_.row_status[iRow] != HighsBasisStatus::kBasic) continue;
    // Basic slack goes into conditioning LP
    basic_var.push_back(incumbent_lp.num_col_ + iRow);
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    if (!constraint) {
      ill_conditioning_matrix.index_.push_back(ill_conditioning_lp_e_row);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  if (constraint) {
    // Add the column e, and transpose the resulting matrix
    for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_matrix.num_row_ = incumbent_lp.num_row_;
    ill_conditioning_matrix.num_col_ = incumbent_lp.num_row_ + 1;
    ill_conditioning_matrix.ensureRowwise();
    ill_conditioning_matrix.format_ = MatrixFormat::kColwise;
  }
  // Now add the variables to measure the infeasibilities
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    // Adding x_+ with cost 1
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    // Subtracting x_- with cost 1
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  ill_conditioning_lp.num_col_ = 3 * incumbent_lp.num_row_;
  ill_conditioning_matrix.num_col_ = ill_conditioning_lp.num_col_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
}